

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s3io.c
# Opt level: O3

int wr_bin_hdr(FILE *fp)

{
  ulong uVar1;
  int iVar2;
  uint uVar3;
  int32 iVar4;
  size_t sVar5;
  size_t sVar6;
  long lVar7;
  char *pcVar8;
  ulong uVar9;
  ulong uVar10;
  char **ppcVar11;
  
  iVar2 = fprintf((FILE *)fp,"s3\n");
  if (iVar2 == 3) {
    if (attrib[0] != (char *)0x0) {
      ppcVar11 = attrib;
      pcVar8 = attrib[0];
      uVar1 = 1;
      uVar10 = 0;
      do {
        uVar9 = uVar1;
        iVar2 = fprintf((FILE *)fp,"%s %s\n",pcVar8,value[uVar10]);
        sVar5 = strlen(*ppcVar11);
        sVar6 = strlen(value[uVar10]);
        if (sVar6 + sVar5 + 2 != (long)iVar2) {
          pcVar8 = "Error while attrib/value pair\n";
          lVar7 = 0xd2;
          goto LAB_001063f9;
        }
        ppcVar11 = attrib + uVar9;
        pcVar8 = *ppcVar11;
        uVar1 = (ulong)((int)uVar9 + 1);
        uVar10 = uVar9;
      } while (pcVar8 != (char *)0x0);
    }
    lVar7 = ftell((FILE *)fp);
    uVar3 = (int)lVar7 - 1U & 7;
    if (uVar3 != 0) {
      fwrite("        ",1,8 - (ulong)uVar3,(FILE *)fp);
    }
    iVar2 = fprintf((FILE *)fp,"endhdr\n");
    if (iVar2 == 7) {
      iVar4 = swap_stamp(fp);
      if (iVar4 != 0) {
        return -1;
      }
      return 0;
    }
    pcVar8 = "Error while endhdr marker\n";
    lVar7 = 0xe1;
  }
  else {
    pcVar8 = "Error while writing SPHINX-III ID\n";
    lVar7 = 0xca;
  }
LAB_001063f9:
  err_msg_system(ERR_ERROR,
                 "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/s3io.c"
                 ,lVar7,pcVar8);
  return -1;
}

Assistant:

static int
wr_bin_hdr(FILE *fp)
{
    uint32 i;
    long padding;
    int ret;

    if (fprintf(fp, "s3\n") != 3) {
	E_ERROR_SYSTEM("Error while writing SPHINX-III ID\n");
	goto error_loc;
    }

    for (i = 0; attrib[i]; i++) {
	ret = fprintf(fp, "%s %s\n", attrib[i], value[i]);
	if (ret != (strlen(attrib[i]) + 
		    strlen(value[i]) + 2)) {
	    E_ERROR_SYSTEM("Error while attrib/value pair\n");
	    goto error_loc;
	}
    }

    /* Align to an 8-byte boundary (guarantees natural alignment for
     * whatever follows) */
    padding = ftell(fp) + strlen("endhdr\n");
    padding = 8 - (padding & 7);
    if (padding != 8) {
	fwrite("        ", 1, padding, fp);
    }

    ret = fprintf(fp, "endhdr\n");
    if (ret != strlen("endhdr\n")) {
	E_ERROR_SYSTEM("Error while endhdr marker\n");
	goto error_loc;
    }

    if (swap_stamp(fp) != S3_SUCCESS) {
	goto error_loc;
    }

    return S3_SUCCESS;

error_loc:
    return S3_ERROR;
}